

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resourcemodel.cpp
# Opt level: O2

char * __thiscall FSSResourceModel::index(FSSResourceModel *this,char *__s,int __c)

{
  bool bVar1;
  ulong uVar2;
  undefined4 in_ECX;
  QModelIndex *in_R8;
  
  bVar1 = QModelIndex::isValid(in_R8);
  if (bVar1) {
    uVar2 = (ulong)(byte)in_R8->i | (long)(__c * 0x10000 + 0x10000);
  }
  else {
    uVar2 = (ulong)(__c + 1);
  }
  *(int *)this = __c;
  *(undefined4 *)&this->field_0x4 = in_ECX;
  *(ulong *)&this->field_0x8 = uVar2;
  *(char **)(this + 1) = __s;
  return (char *)this;
}

Assistant:

QModelIndex
FSSResourceModel::index(int row, int column,
                        const QModelIndex &parent) const {
  if (parent.isValid()) {
    return createIndex(row, column,
                       ((row+1) << 16) |
                       (parent.internalId() & 0xFF));
  } else {
    return createIndex(row, column, row+1);
  }
}